

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O1

bool __thiscall dlib::directory::operator==(directory *this,directory *rhs)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  string right;
  string left;
  char buf [4096];
  undefined1 *local_1078;
  char *local_1070;
  undefined1 local_1068 [16];
  undefined1 *local_1058;
  char *local_1050;
  undefined1 local_1048 [16];
  char local_1038 [4104];
  
  if ((rhs->state).full_name._M_string_length == 0 && (this->state).full_name._M_string_length == 0)
  {
    return true;
  }
  bVar4 = false;
  local_1050 = (char *)0x0;
  local_1048[0] = 0;
  local_1070 = (char *)0x0;
  local_1068[0] = 0;
  local_1078 = local_1068;
  local_1058 = local_1048;
  pcVar3 = realpath((this->state).full_name._M_dataplus._M_p,local_1038);
  pcVar1 = local_1050;
  if (pcVar3 != (char *)0x0) {
    strlen(local_1038);
    std::__cxx11::string::_M_replace((ulong)&local_1058,0,pcVar1,(ulong)local_1038);
    pcVar3 = realpath((rhs->state).full_name._M_dataplus._M_p,local_1038);
    pcVar1 = local_1070;
    if (pcVar3 != (char *)0x0) {
      strlen(local_1038);
      std::__cxx11::string::_M_replace((ulong)&local_1078,0,pcVar1,(ulong)local_1038);
      if (local_1050 == local_1070) {
        if (local_1050 == (char *)0x0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp(local_1058,local_1078,(size_t)local_1050);
          bVar4 = iVar2 == 0;
        }
        goto LAB_0023ed41;
      }
    }
    bVar4 = false;
  }
LAB_0023ed41:
  if (local_1078 != local_1068) {
    operator_delete(local_1078);
  }
  if (local_1058 != local_1048) {
    operator_delete(local_1058);
  }
  return bVar4;
}

Assistant:

bool directory::
    operator == (
        const directory& rhs
    ) const 
    { 
        using namespace std;
        if (state.full_name.size() == 0 && rhs.state.full_name.size() == 0)
            return true;

        // These directories might have different names but actually represent the same
        // directory due to the presence of symbolic links.
        char buf[PATH_MAX];
        string left, right;
        if (realpath(state.full_name.c_str(),buf) == 0)
            return false;    
        left = buf;

        if (realpath(rhs.state.full_name.c_str(),buf) == 0)
            return false;    
        right = buf;

        return (left == right);
    }